

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
jaegertracing::net::IPAddress::parse
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,string *hostPort)

{
  long lVar1;
  long *plVar2;
  int port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> portStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ip;
  istringstream iss;
  
  lVar1 = std::__cxx11::string::find((char)hostPort,0x3a);
  std::__cxx11::string::substr((ulong)&ip,(ulong)hostPort);
  port = 0;
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&portStr,(ulong)hostPort);
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&portStr,_S_in);
    plVar2 = (long *)std::istream::operator>>((istream *)&iss,&port);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) {
      port = 0;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    std::__cxx11::string::~string((string *)&portStr);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ip);
  __return_storage_ptr__->second = port;
  std::__cxx11::string::~string((string *)&ip);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::string, int> parse(const std::string& hostPort)
    {
        const auto colonPos = hostPort.find(':');
        const auto ip = hostPort.substr(0, colonPos);
        int port = 0;
        if (colonPos != std::string::npos) {
            const auto portStr = hostPort.substr(colonPos + 1);
            std::istringstream iss(portStr);
            if (!(iss >> port)) {
                port = 0;
            }
        }
        return std::make_pair(ip, port);
    }